

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

int Ses_StoreAddEntry(Ses_Store_t *pStore,word *pTruth,int nVars,int *pArrTimeProfile,char *pSol,
                     int fResLimit)

{
  long *plVar1;
  uint uVar2;
  bool bVar3;
  Ses_TruthEntry_t *__dest;
  Ses_TimesEntry_t *pSVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  
  if (pSol != (char *)0x0) {
    Abc_ExactNormalizeArrivalTimesForNetwork(nVars,pArrTimeProfile,pSol);
  }
  uVar2 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar2 = 1;
  }
  uVar13 = (ulong)uVar2;
  uVar8 = 0;
  if (0 < (int)uVar2) {
    uVar5 = 0;
    do {
      uVar7 = (uint)uVar8 ^
              *(int *)(Ses_StoreTableHash_s_Primes + (ulong)((uint)uVar5 & 0xf) * 4) *
              (int)pTruth[uVar5];
      uVar8 = (ulong)uVar7;
      uVar5 = uVar5 + 1;
    } while (uVar13 != uVar5);
    uVar8 = (ulong)(uVar7 & 0x3ff);
  }
  for (__dest = pStore->pEntries[uVar8]; __dest != (Ses_TruthEntry_t *)0x0; __dest = __dest->next) {
    if (((int)uVar2 < 1) || (__dest->nVars != nVars)) {
      if (__dest->nVars == nVars) goto LAB_002b95c3;
    }
    else {
      uVar5 = 0;
      while (__dest->pTruth[uVar5] == pTruth[uVar5]) {
        uVar5 = uVar5 + 1;
        if (uVar13 == uVar5) goto LAB_002b95c3;
      }
    }
  }
  __dest = (Ses_TruthEntry_t *)calloc(1,0x38);
  __dest->nVars = nVars;
  if (0 < (int)uVar2) {
    memcpy(__dest,pTruth,uVar13 << 3);
  }
  __dest->next = pStore->pEntries[uVar8];
  pStore->pEntries[uVar8] = __dest;
LAB_002b95c3:
  pSVar4 = __dest->head;
  bVar14 = pSVar4 == (Ses_TimesEntry_t *)0x0;
  bVar15 = bVar14;
  if (!bVar14) {
    iVar12 = 0;
    do {
      bVar3 = bVar14;
      if (nVars < 1) goto LAB_002b9675;
      uVar8 = 0;
      while (pArrTimeProfile[uVar8] == pSVar4->pArrTimeProfile[uVar8]) {
        uVar8 = uVar8 + 1;
        bVar3 = bVar15;
        if ((uint)nVars == uVar8) goto LAB_002b9675;
      }
      pSVar4 = pSVar4->next;
      bVar15 = pSVar4 == (Ses_TimesEntry_t *)0x0;
    } while (!bVar15);
  }
  pSVar4 = (Ses_TimesEntry_t *)calloc(1,0x38);
  if (0 < nVars) {
    memcpy(pSVar4,pArrTimeProfile,(ulong)(uint)nVars << 2);
  }
  pSVar4->pNetwork = pSol;
  pSVar4->fResLimit = fResLimit;
  pSVar4->next = __dest->head;
  __dest->head = pSVar4;
  pStore->nEntriesCount = pStore->nEntriesCount + 1;
  iVar12 = 1;
  bVar3 = bVar15;
  if (pSol != (char *)0x0) {
    pStore->nValidEntriesCount = pStore->nValidEntriesCount + 1;
  }
LAB_002b9675:
  bVar15 = fResLimit == 0;
  lVar6 = 0x21c0;
  if (bVar15) {
    lVar6 = 0x2170;
  }
  lVar11 = 0x21c8;
  if (bVar15) {
    lVar11 = 0x2178;
  }
  lVar9 = 0x20d0;
  if (bVar15) {
    lVar9 = 0x2080;
  }
  lVar10 = 0x20d8;
  if (bVar15) {
    lVar10 = 0x2088;
  }
  if (pSol != (char *)0x0) {
    lVar10 = lVar11;
    lVar9 = lVar6;
  }
  plVar1 = (long *)((long)pStore->pEntries + lVar9 + -0x18);
  *plVar1 = *plVar1 + 1;
  lVar9 = (long)pStore->pEntries + lVar10 + -0x18;
  plVar1 = (long *)(lVar9 + (long)nVars * 8);
  *plVar1 = *plVar1 + 1;
  if ((bVar3) && (pStore->szDBName != (char *)0x0)) {
    Ses_StoreWrite(pStore,pStore->szDBName,nVars,(int)lVar6,(int)lVar9,(int)lVar11);
  }
  return iVar12;
}

Assistant:

int Ses_StoreAddEntry( Ses_Store_t * pStore, word * pTruth, int nVars, int * pArrTimeProfile, char * pSol, int fResLimit )
{
    int key, fAdded;
    Ses_TruthEntry_t * pTEntry;
    Ses_TimesEntry_t * pTiEntry;

    if ( pSol )
        Abc_ExactNormalizeArrivalTimesForNetwork( nVars, pArrTimeProfile, pSol );

    key = Ses_StoreTableHash( pTruth, nVars );
    pTEntry = pStore->pEntries[key];

    /* does truth table already exist? */
    while ( pTEntry )
    {
        if ( Ses_StoreTruthEqual( pTEntry, pTruth, nVars ) )
            break;
        else
            pTEntry = pTEntry->next;
    }

    /* entry does not yet exist, so create new one and enqueue */
    if ( !pTEntry )
    {
        pTEntry = ABC_CALLOC( Ses_TruthEntry_t, 1 );
        Ses_StoreTruthCopy( pTEntry, pTruth, nVars );
        pTEntry->next = pStore->pEntries[key];
        pStore->pEntries[key] = pTEntry;
    }

    /* does arrival time already exist? */
    pTiEntry = pTEntry->head;
    while ( pTiEntry )
    {
        if ( Ses_StoreTimesEqual( pArrTimeProfile, pTiEntry->pArrTimeProfile, nVars ) )
            break;
        else
            pTiEntry = pTiEntry->next;
    }

    /* entry does not yet exist, so create new one and enqueue */
    if ( !pTiEntry )
    {
        pTiEntry = ABC_CALLOC( Ses_TimesEntry_t, 1 );
        Ses_StoreTimesCopy( pTiEntry->pArrTimeProfile, pArrTimeProfile, nVars );
        pTiEntry->pNetwork = pSol;
        pTiEntry->fResLimit = fResLimit;
        pTiEntry->next = pTEntry->head;
        pTEntry->head = pTiEntry;

        /* item has been added */
        fAdded = 1;
        pStore->nEntriesCount++;
        if ( pSol )
            pStore->nValidEntriesCount++;
    }
    else
    {
        //assert( 0 );
        /* item was already present */
        fAdded = 0;
    }

    /* statistics */
    if ( pSol )
    {
        if ( fResLimit )
        {
            pStore->nSynthesizedRL++;
            pStore->pSynthesizedRL[nVars]++;
        }
        else
        {
            pStore->nSynthesizedImp++;
            pStore->pSynthesizedImp[nVars]++;
        }
    }
    else
    {
        if ( fResLimit )
        {
            pStore->nUnsynthesizedRL++;
            pStore->pUnsynthesizedRL[nVars]++;
        }
        else
        {
            pStore->nUnsynthesizedImp++;
            pStore->pUnsynthesizedImp[nVars]++;
        }
    }

    if ( fAdded && pStore->szDBName )
        Ses_StoreWrite( pStore, pStore->szDBName, 1, 0, 0, 0 );

    return fAdded;
}